

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditional_entropy.c
# Opt level: O1

double * inform_local_conditional_entropy
                   (int *xs,int *ys,size_t n,int bx,int by,double *ce,inform_error *err)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  bool bVar3;
  _Bool _Var4;
  double *__ptr;
  inform_dist *dist;
  inform_dist *dist_00;
  size_t sVar5;
  size_t i;
  double dVar6;
  
  _Var4 = check_arguments(xs,ys,n,bx,by,err);
  if (_Var4) {
    return (double *)0x0;
  }
  __ptr = ce;
  if ((ce == (double *)0x0) && (__ptr = (double *)malloc(n * 8), __ptr == (double *)0x0)) {
    if (err == (inform_error *)0x0) {
      return (double *)0x0;
    }
    *err = INFORM_ENOMEM;
    return (double *)0x0;
  }
  dist = inform_dist_alloc((long)bx);
  if (dist == (inform_dist *)0x0) {
    dist_00 = (inform_dist *)0x0;
    if (err != (inform_error *)0x0) goto LAB_0010341b;
  }
  else {
    dist_00 = inform_dist_alloc((long)(bx * by));
    if (dist_00 != (inform_dist *)0x0) {
      bVar3 = false;
      goto LAB_00103423;
    }
    inform_dist_free(dist);
    if (err == (inform_error *)0x0) {
      bVar3 = true;
      goto LAB_00103423;
    }
LAB_0010341b:
    *err = INFORM_ENOMEM;
  }
  bVar3 = true;
LAB_00103423:
  if (bVar3) {
    if (ce == (double *)0x0) {
      free(__ptr);
    }
    return (double *)0x0;
  }
  dist->counts = n;
  dist_00->counts = n;
  if (n != 0) {
    puVar1 = dist->histogram;
    puVar2 = dist_00->histogram;
    sVar5 = 0;
    do {
      puVar1[xs[sVar5]] = puVar1[xs[sVar5]] + 1;
      puVar2[(long)ys[sVar5] + (long)xs[sVar5] * (long)by] =
           puVar2[(long)ys[sVar5] + (long)xs[sVar5] * (long)by] + 1;
      sVar5 = sVar5 + 1;
    } while (n != sVar5);
    sVar5 = 0;
    do {
      dVar6 = log2((double)dist->histogram[xs[sVar5]] /
                   (double)dist_00->histogram[(long)ys[sVar5] + (long)xs[sVar5] * (long)by]);
      __ptr[sVar5] = dVar6;
      sVar5 = sVar5 + 1;
    } while (n != sVar5);
  }
  inform_dist_free(dist);
  inform_dist_free(dist_00);
  return __ptr;
}

Assistant:

double *inform_local_conditional_entropy(int const *xs, int const *ys,
    size_t n, int bx, int by, double *ce, inform_error *err)
{
    if (check_arguments(xs, ys, n, bx, by, err)) return NULL;

    bool allocate_ce = (ce == NULL);
    if (allocate_ce)
    {
        ce = malloc(n * sizeof(double));
        if (ce == NULL)
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist *x = NULL, *xy = NULL;
    if (allocate(bx, by, &x, &xy, err))
    {
        if (allocate_ce) free(ce);
        return NULL;
    }

    accumulate(xs, ys, n, by, x, xy);

    double s, m;
    for (size_t i = 0; i < n; ++i)
    {
        int z = xs[i]*by + ys[i];
        s = xy->histogram[z];
        m = x->histogram[xs[i]];
        ce[i] = log2(m/s);
    }

    free_all(&x, &xy);

    return ce;
}